

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerWeakReference.h
# Opt level: O3

void __thiscall
Memory::WeakReferenceHashTable<PrimePolicy>::WeakReferenceHashTable
          (WeakReferenceHashTable<PrimePolicy> *this,uint size,HeapAllocator *allocator)

{
  uint uVar1;
  undefined4 *puVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  BOOL BVar6;
  HeapAllocator *this_00;
  RecyclerWeakReferenceBase **__s;
  size_t byteSize;
  undefined8 *in_FS_OFFSET;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  this->allocator = allocator;
  this->count = 0;
  this->size = 0;
  this->freeList = (RecyclerWeakReferenceBase *)0x0;
  this->modFunctionIndex = 0x4b;
  uVar5 = PrimePolicy::GetPrime(size,&this->modFunctionIndex);
  this->size = uVar5;
  data.plusSize = (size_t)uVar5;
  local_50 = (undefined1  [8])&RecyclerWeakReferenceBase*::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_14a54c;
  data.filename._0_4_ = 0x7f;
  this_00 = HeapAllocator::TrackAllocInfo(allocator,(TrackAllocData *)local_50);
  uVar1 = this->size;
  BVar6 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar6 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                       "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar4) goto LAB_0027690c;
    *puVar2 = 0;
  }
  byteSize = (ulong)uVar1 << 3;
  __s = (RecyclerWeakReferenceBase **)HeapAllocator::AllocT<false>(this_00,byteSize);
  memset(__s,0,byteSize);
  if (__s == (RecyclerWeakReferenceBase **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar4) {
LAB_0027690c:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar2 = 0;
  }
  this->buckets = __s;
  return;
}

Assistant:

WeakReferenceHashTable(uint size, HeapAllocator* allocator):
        count(0),
        size(0),
        modFunctionIndex(UNKNOWN_MOD_INDEX),
        allocator(allocator),
        freeList(nullptr)
    {
        this->size = SizePolicy::GetSize(size, &modFunctionIndex);
        buckets = AllocatorNewArrayZ(HeapAllocator, allocator, RecyclerWeakReferenceBase*, this->size);
    }